

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBrokerData.cpp
# Opt level: O3

shared_ptr<helics::helicsCLI11App> __thiscall
helics::NetworkBrokerData::commandLineParser
          (NetworkBrokerData *this,string_view localAddress,bool enableConfig)

{
  HelicsConfigJSON *pHVar1;
  Option *pOVar2;
  Option *this_00;
  App *pAVar3;
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *variable;
  int in_R8D;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_01;
  shared_ptr<helics::helicsCLI11App> sVar7;
  _Any_data local_c40;
  _Manager_type local_c30;
  code *local_c28;
  _Any_data local_c20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c10;
  _Any_data local_c00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_be0;
  undefined8 local_bd8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bd0;
  undefined4 local_bc0;
  undefined2 local_bbc;
  code *local_bb8;
  code *local_bb0;
  string local_ba8;
  string local_b88;
  string local_b68;
  _Any_data local_b48;
  code *local_b38;
  code *local_b30;
  string local_b28;
  string local_b08;
  undefined1 *local_ae8 [2];
  undefined1 local_ad8 [16];
  long *local_ac8;
  long local_ac0;
  long local_ab8 [2];
  string local_aa8;
  string local_a88;
  string local_a68;
  string local_a48;
  string local_a28;
  string local_a08;
  string local_9e8;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  _Any_data local_508;
  code *local_4f8;
  code *pcStack_4f0;
  _Any_data local_4e8;
  code *local_4d8;
  undefined8 uStack_4d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_488;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_448;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_408;
  string local_3c8;
  string local_3a8;
  _Any_data local_388;
  code *local_378;
  undefined8 local_370;
  _Any_data local_368;
  code *local_358;
  undefined8 local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_348;
  undefined8 local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  undefined4 local_328;
  undefined2 local_324;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  _Any_data local_2f8;
  code *local_2e8;
  undefined8 local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  size_type local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined4 local_2b8;
  undefined2 local_2b4;
  _Any_data local_2a8;
  code *local_298;
  undefined8 local_290;
  _Any_data local_288;
  code *local_278;
  undefined8 local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  undefined8 local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined4 local_248;
  undefined2 local_244;
  _Any_data local_240;
  code *local_230;
  code *local_228;
  _Any_data local_220;
  code *local_210;
  _Any_data local_200;
  code *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  undefined4 local_1c0;
  undefined1 local_1bc;
  undefined1 uStack_1bb;
  _Any_data local_1b8;
  code *local_1a8;
  _Any_data local_198;
  code *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  undefined4 local_158;
  undefined1 local_154;
  undefined1 uStack_153;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_bb0 = (code *)CONCAT71(in_register_00000009,enableConfig);
  local_bb8 = (code *)localAddress._M_str;
  variable = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             localAddress._M_len;
  (this->brokerName)._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<helics::helicsCLI11App,std::allocator<helics::helicsCLI11App>,char_const(&)[94]>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->brokerName)._M_string_length,
             (helicsCLI11App **)this,(allocator<helics::helicsCLI11App> *)&local_508,
             (char (*) [94])
             "Network connection information \n(arguments allow \'_\' characters in the names and ignore them)"
            );
  if (in_R8D != 0) {
    pHVar1 = addJsonConfig((App *)(this->brokerName)._M_dataplus._M_p);
    (pHVar1->super_ConfigBase).maximumLayers = '\0';
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"helics","");
    commandLineParser();
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  (pAVar3->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_ = true;
  (pAVar3->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_underscore_ = true;
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,"--local{0},--ipv4{4},--ipv6{6},--all{10},--external{10}","");
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c8,"specify external interface to use, default is --local","");
  pOVar2 = CLI::App::add_flag<gmlc::networking::InterfaceNetworks,_(CLI::detail::enabler)0>
                     (pAVar3,&local_3a8,
                      (InterfaceNetworks *)(variable[5].field_2._M_local_buf + 0xc),&local_3c8);
  (pOVar2->super_OptionBase<CLI::Option>).disable_flag_override_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_b08._M_dataplus._M_p = (pointer)&local_b08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b08,"--network_connectivity","");
  local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b28,"specify the connectivity of the network interface","");
  this_00 = CLI::App::
            add_option<gmlc::networking::InterfaceNetworks,_gmlc::networking::InterfaceNetworks,_(CLI::detail::enabler)0>
                      (pAVar3,&local_b08,
                       (InterfaceNetworks *)(variable[5].field_2._M_local_buf + 0xc),&local_b28);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[2],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_508,(char (*) [6])0x41fa35,(char (*) [2])0x456c13);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[2],_true>
            (&local_4c8,(char (*) [5])"ipv4",(char (*) [2])0x450744);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[2],_true>
            (&local_488,(char (*) [5])"ipv6",(char (*) [2])0x45a20f);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_const_char_(&)[3],_true>
            (&local_448,(char (*) [9])"external",(char (*) [3])0x450ac5);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[3],_true>
            (&local_408,(char (*) [4])0x44b85c,(char (*) [3])0x450ac5);
  values._M_len = 5;
  values._M_array = (iterator)&local_508;
  CLI::CheckedTransformer::CheckedTransformer<>((CheckedTransformer *)&local_c20,values);
  local_2a8._M_unused._M_object = (void *)0x0;
  local_2a8._8_8_ = 0;
  local_298 = (code *)0x0;
  local_290 = local_c10._8_8_;
  if ((code *)local_c10._M_allocated_capacity != (code *)0x0) {
    local_2a8._M_unused._M_object = local_c20._M_unused._M_object;
    local_2a8._8_8_ = local_c20._8_8_;
    local_298 = (code *)local_c10._M_allocated_capacity;
    local_c10._M_allocated_capacity = 0;
    local_c10._8_8_ = 0;
  }
  local_288._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_288._8_8_ = 0;
  local_278 = (code *)0x0;
  local_270 = local_bf0._8_8_;
  if ((code *)local_bf0._M_allocated_capacity != (code *)0x0) {
    local_288._M_unused._M_object = local_c00._M_unused._M_object;
    local_288._8_8_ = local_c00._8_8_;
    local_278 = (code *)local_bf0._M_allocated_capacity;
    local_bf0._M_allocated_capacity = 0;
    local_bf0._8_8_ = 0;
  }
  if (local_be0 == &local_bd0) {
    local_258._8_4_ = local_bd0._8_4_;
    local_258._12_4_ = local_bd0._12_4_;
    local_268 = &local_258;
  }
  else {
    local_268 = local_be0;
  }
  local_258._M_allocated_capacity._4_4_ = local_bd0._M_allocated_capacity._4_4_;
  local_258._M_allocated_capacity._0_4_ = local_bd0._M_allocated_capacity._0_4_;
  local_260 = local_bd8;
  local_bd8 = 0;
  local_bd0._M_allocated_capacity._0_4_ = local_bd0._M_allocated_capacity._0_4_ & 0xffffff00;
  local_248 = local_bc0;
  local_244 = local_bbc;
  local_c40._M_unused._M_object = &local_c30;
  local_be0 = &local_bd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c40,"");
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (&this_00->validators_,
             (this_00->validators_).
             super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
             super__Vector_impl_data._M_start,(value_type *)&local_2a8);
  if (local_c40._8_8_ != 0) {
    local_ae8[0] = local_ad8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_ae8,local_c40._M_unused._M_object,
               local_c40._8_8_ + (long)local_c40._M_unused._0_8_);
    commandLineParser();
  }
  CLI::Option::excludes(this_00,pOVar2);
  if ((_Manager_type *)local_c40._M_unused._0_8_ != &local_c30) {
    operator_delete(local_c40._M_unused._M_object,(ulong)(local_c30 + 1));
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258._M_allocated_capacity + 1);
  }
  if (local_278 != (code *)0x0) {
    (*local_278)(&local_288,&local_288,__destroy_functor);
  }
  if (local_298 != (code *)0x0) {
    (*local_298)(&local_2a8,&local_2a8,__destroy_functor);
  }
  if (local_be0 != &local_bd0) {
    operator_delete(local_be0,
                    CONCAT44(local_bd0._M_allocated_capacity._4_4_,
                             local_bd0._M_allocated_capacity._0_4_) + 1);
  }
  if ((code *)local_bf0._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_bf0._M_allocated_capacity)(&local_c00,&local_c00,3);
  }
  if ((code *)local_c10._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_c10._M_allocated_capacity)(&local_c20,&local_c20,3);
  }
  lVar5 = -0x140;
  paVar6 = &local_408.second.field_2;
  do {
    if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar6->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],paVar6->_M_allocated_capacity + 1
                     );
    }
    if (&paVar6->_M_allocated_capacity + -4 != (size_type *)(&paVar6->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar6->_M_allocated_capacity)[-6],
                      (&paVar6->_M_allocated_capacity)[-4] + 1);
    }
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar6->_M_allocated_capacity + -8);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p,local_b28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
    operator_delete(local_b08._M_dataplus._M_p,local_b08.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"--broker_address","");
  local_508._8_8_ = 0;
  local_508._M_unused._M_object = operator_new(0x18);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_508._M_unused._0_8_ =
       variable;
  *(code **)((long)local_508._M_unused._0_8_ + 8) = local_bb8;
  *(code **)((long)local_508._M_unused._0_8_ + 0x10) = local_bb0;
  pcStack_4f0 = CLI::std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:48:13)>
                ::_M_invoke;
  local_4f8 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:48:13)>
              ::_M_manager;
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_548,"location of the broker i.e. network address","");
  pOVar2 = CLI::App::add_option_function<std::__cxx11::string>
                     (pAVar3,&local_528,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_508,&local_548);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"HELICS_BROKER_ADDRESS","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar2->envname_,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  if (local_4f8 != (code *)0x0) {
    (*local_4f8)(&local_508,&local_508,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"--reuse_address","");
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_588,
             "allow the server to reuse a bound address, mostly useful for tcp cores","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar3,&local_568,(bool *)(variable[5].field_2._M_local_buf + 0xd),&local_588);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"--noackconnect","");
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5c8,
             "specify that a connection_ack message is not required to be connected with a broker",
             "");
  pOVar2 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                     (pAVar3,&local_5a8,(bool *)((long)&variable[6]._M_dataplus._M_p + 1),&local_5c8
                     );
  CLI::Option::ignore_underscore<CLI::App>(pOVar2,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"--force","");
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_608,
             "if set to true the broker will on an unsuccessful connection as root broker attempt to terminate any existing brokers and reconnect"
             ,"");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar3,&local_5e8,(bool *)((long)&variable[6]._M_dataplus._M_p + 6),&local_608);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"--broker","");
  local_508._8_8_ = 0;
  local_508._M_unused._M_object = operator_new(0x18);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_508._M_unused._0_8_ =
       variable;
  *(code **)((long)local_508._M_unused._0_8_ + 8) = local_bb8;
  *(code **)((long)local_508._M_unused._0_8_ + 0x10) = local_bb0;
  pcStack_4f0 = CLI::std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:72:9)>
                ::_M_invoke;
  local_4f8 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:72:9)>
              ::_M_manager;
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_648,
             "identifier for the broker, this is either the name or network address use --broker_address or --brokername to explicitly set the network address or name the search for the broker is first by name"
             ,"");
  CLI::App::add_option_function<std::__cxx11::string>
            (pAVar3,&local_628,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_508,&local_648);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
  }
  if (local_4f8 != (code *)0x0) {
    (*local_4f8)(&local_508,&local_508,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"--brokername","");
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,"the name of the broker","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar3,&local_668,variable,&local_688);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"--maxsize","");
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"The message buffer size","")
  ;
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_6a8,(int *)variable[5].field_2._M_local_buf,&local_6c8);
  pOVar2 = CLI::Option::capture_default_str(pOVar2);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)&local_1b8,
           (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)CLI::PositiveNumber);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_198,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)(CLI::PositiveNumber + 0x20));
  local_178[0] = &local_168;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_178,CLI::PositiveNumber._64_8_,
             CLI::PositiveNumber._72_8_ + CLI::PositiveNumber._64_8_);
  _local_154 = CLI::PositiveNumber._100_2_;
  local_158 = CLI::PositiveNumber._96_4_;
  local_c20._M_unused._M_object = &local_c10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c20,"");
  _local_154 = CONCAT11(1,local_154);
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::emplace_back<CLI::Validator>
            (&pOVar2->validators_,(Validator *)&local_1b8);
  if (local_c20._8_8_ != 0) {
    local_508._M_unused._M_object = &local_4f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_508,local_c20._M_unused._M_object,
               local_c20._8_8_ + (long)local_c20._M_unused._0_8_);
    commandLineParser();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c20._M_unused._0_8_ != &local_c10) {
    operator_delete(local_c20._M_unused._M_object,(ulong)(local_c10._M_allocated_capacity + 1));
  }
  if (local_178[0] != &local_168) {
    operator_delete(local_178[0],local_168._M_allocated_capacity + 1);
  }
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"--maxcount","");
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_708,"The maximum number of message to have in a queue","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_6e8,(int *)(variable[5].field_2._M_local_buf + 4),&local_708);
  pOVar2 = CLI::Option::capture_default_str(pOVar2);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)&local_220,
           (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)CLI::PositiveNumber);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_200,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)(CLI::PositiveNumber + 0x20));
  local_1e0[0] = &local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,CLI::PositiveNumber._64_8_,
             CLI::PositiveNumber._72_8_ + CLI::PositiveNumber._64_8_);
  _local_1bc = CLI::PositiveNumber._100_2_;
  local_1c0 = CLI::PositiveNumber._96_4_;
  local_c20._M_unused._M_object = &local_c10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c20,"");
  _local_1bc = CONCAT11(1,local_1bc);
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::emplace_back<CLI::Validator>
            (&pOVar2->validators_,(Validator *)&local_220);
  if (local_c20._8_8_ != 0) {
    local_508._M_unused._M_object = &local_4f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_508,local_c20._M_unused._M_object,
               local_c20._8_8_ + (long)local_c20._M_unused._0_8_);
    commandLineParser();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c20._M_unused._0_8_ != &local_c10) {
    operator_delete(local_c20._M_unused._M_object,(ulong)(local_c10._M_allocated_capacity + 1));
  }
  if (local_1e0[0] != &local_1d0) {
    operator_delete(local_1e0[0],local_1d0._M_allocated_capacity + 1);
  }
  if (local_1f0 != (code *)0x0) {
    (*local_1f0)(&local_200,&local_200,__destroy_functor);
  }
  if (local_210 != (code *)0x0) {
    (*local_210)(&local_220,&local_220,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"--networkretries","");
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_748,"the maximum number of network retries","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_728,(int *)(variable[5].field_2._M_local_buf + 8),&local_748);
  CLI::Option::capture_default_str(pOVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"--useosport","");
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_788,
             "specify that the ports should be allocated by the host operating system","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar3,&local_768,(bool *)(variable[5].field_2._M_local_buf + 0xe),&local_788);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"--autobroker","");
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7c8,
             "allow a broker to be automatically created if one is not available","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar3,&local_7a8,(bool *)(variable[5].field_2._M_local_buf + 0xf),&local_7c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e8,"--brokerinitstring","");
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_808,"the initialization string for the broker","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar3,&local_7e8,variable + 3,&local_808);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
    operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"--brokerinit","");
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_848,"the initialization string for the broker","");
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar3,&local_828,variable + 3,&local_848);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"HELICS_BROKER_INIT","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar2->envname_,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"--client{0},--server{1}","")
  ;
  local_b48._8_8_ = 0;
  local_b30 = CLI::std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:116:13)>
              ::_M_invoke;
  local_b38 = CLI::std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:116:13)>
              ::_M_manager;
  local_b48._M_unused._0_8_ = (undefined8)variable;
  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_888,"specify that the network connection should be a server or client"
             ,"");
  pOVar2 = CLI::App::add_flag_function
                     (pAVar3,&local_868,(function<void_(long)> *)&local_b48,&local_888);
  (pOVar2->super_OptionBase<CLI::Option>).disable_flag_override_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p,local_888.field_2._M_allocated_capacity + 1);
  }
  if (local_b38 != (code *)0x0) {
    (*local_b38)(&local_b48,&local_b48,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a8,"--local_interface","");
  local_508._8_8_ = 0;
  pcStack_4f0 = CLI::std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:132:9)>
                ::_M_invoke;
  local_4f8 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:132:9)>
              ::_M_manager;
  local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
  local_508._M_unused._0_8_ = (undefined8)variable;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8c8,"the local interface to use for the receive ports","");
  CLI::App::add_option_function<std::__cxx11::string>
            (pAVar3,&local_8a8,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_508,&local_8c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
    operator_delete(local_8c8._M_dataplus._M_p,local_8c8.field_2._M_allocated_capacity + 1);
  }
  if (local_4f8 != (code *)0x0) {
    (*local_4f8)(&local_508,&local_508,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
    operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e8,"--port,-p","");
  local_b68._M_dataplus._M_p = (pointer)&local_b68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b68,"port number to use","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_8e8,(int *)(variable + 5),&local_b68);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_c20,(char (*) [5])0x43f940,(char (*) [3])0x45a145);
  values_00._M_len = 1;
  values_00._M_array = (iterator)&local_c20;
  CLI::Transformer::Transformer<std::__cxx11::string(&)(std::__cxx11::string)>
            ((Transformer *)&local_508,values_00,CLI::ignore_case);
  local_318._M_unused._M_object =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_318._8_8_ = 0;
  local_308 = (code *)0x0;
  local_300 = pcStack_4f0;
  if (local_4f8 != (code *)0x0) {
    local_318._M_unused._M_object = local_508._M_unused._M_object;
    local_318._8_8_ = local_508._8_8_;
    local_308 = local_4f8;
    local_4f8 = (code *)0x0;
    pcStack_4f0 = (code *)0x0;
  }
  local_2f8._M_unused._M_object = (void *)0x0;
  local_2f8._8_8_ = 0;
  local_2e8 = (code *)0x0;
  local_2e0 = uStack_4d0;
  if (local_4d8 != (code *)0x0) {
    local_2f8._M_unused._M_object = local_4e8._M_unused._M_object;
    local_2f8._8_8_ = local_4e8._8_8_;
    local_2e8 = local_4d8;
    local_4d8 = (code *)0x0;
    uStack_4d0 = 0;
  }
  paVar6 = &local_4c8.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.first._M_dataplus._M_p == paVar6) {
    local_2c8._8_4_ = local_4c8.first.field_2._8_4_;
    local_2c8._12_4_ = local_4c8.first.field_2._12_4_;
    local_2d8 = &local_2c8;
  }
  else {
    local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8.first._M_dataplus._M_p;
  }
  local_2c8._M_allocated_capacity._4_4_ = local_4c8.first.field_2._M_allocated_capacity._4_4_;
  local_2c8._M_allocated_capacity._0_4_ = local_4c8.first.field_2._M_allocated_capacity._0_4_;
  local_2d0 = local_4c8.first._M_string_length;
  local_4c8.first._M_string_length = 0;
  local_4c8.first.field_2._M_allocated_capacity._0_4_ =
       local_4c8.first.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_2b8 = local_4c8.second._M_dataplus._M_p._0_4_;
  local_2b4 = local_4c8.second._M_dataplus._M_p._4_2_;
  local_c40._M_unused._M_object = &local_c30;
  local_4c8.first._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c40,"");
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (&pOVar2->validators_,
             (pOVar2->validators_).
             super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
             super__Vector_impl_data._M_start,(value_type *)&local_318);
  if (local_c40._8_8_ != 0) {
    local_ae8[0] = local_ad8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_ae8,local_c40._M_unused._M_object,
               local_c40._8_8_ + (long)local_c40._M_unused._0_8_);
    commandLineParser();
  }
  if ((_Manager_type *)local_c40._M_unused._0_8_ != &local_c30) {
    operator_delete(local_c40._M_unused._M_object,(ulong)(local_c30 + 1));
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
  }
  if (local_2e8 != (code *)0x0) {
    (*local_2e8)(&local_2f8,&local_2f8,__destroy_functor);
  }
  if (local_308 != (code *)0x0) {
    (*local_308)(&local_318,&local_318,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.first._M_dataplus._M_p != paVar6) {
    operator_delete(local_4c8.first._M_dataplus._M_p,
                    CONCAT44(local_4c8.first.field_2._M_allocated_capacity._4_4_,
                             local_4c8.first.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_4d8 != (code *)0x0) {
    (*local_4d8)(&local_4e8,&local_4e8,3);
  }
  if (local_4f8 != (code *)0x0) {
    (*local_4f8)(&local_508,&local_508,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c00._M_unused._0_8_ != &local_bf0) {
    operator_delete(local_c00._M_unused._M_object,(ulong)(local_bf0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c20._M_unused._0_8_ != &local_c10) {
    operator_delete(local_c20._M_unused._M_object,(ulong)(local_c10._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b68._M_dataplus._M_p != &local_b68.field_2) {
    operator_delete(local_b68._M_dataplus._M_p,local_b68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
    operator_delete(local_8e8._M_dataplus._M_p,local_8e8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"--brokerport","");
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_928,"the port number to use to connect with the broker","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_908,(int *)((long)&variable[5]._M_dataplus._M_p + 4),&local_928)
  ;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"HELICS_BROKER_PORT","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar2->envname_,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_948,"--connectionport","");
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_968,"the port number to use to connect a co-simulation","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_948,(int *)&variable[5]._M_string_length,&local_968);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"HELICS_CONNECTION_PORT","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar2->envname_,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._M_dataplus._M_p != &local_968.field_2) {
    operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948._M_dataplus._M_p != &local_948.field_2) {
    operator_delete(local_948._M_dataplus._M_p,local_948.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_988,"--connectionaddress","");
  local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9a8,"the network address to use to connect a co-simulation","");
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar3,&local_988,variable + 4,&local_9a8);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"HELICS_CONNECTION_ADDRESS","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar2->envname_,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
    operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988._M_dataplus._M_p != &local_988.field_2) {
    operator_delete(local_988._M_dataplus._M_p,local_988.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_b88._M_dataplus._M_p = (pointer)&local_b88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b88,"--localport","");
  local_c40._8_8_ = 0;
  local_c28 = CLI::std::
              _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:160:13)>
              ::_M_invoke;
  local_c30 = CLI::std::
              _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:160:13)>
              ::_M_manager;
  local_ba8._M_dataplus._M_p = (pointer)&local_ba8.field_2;
  local_c40._M_unused._0_8_ = (undefined8)variable;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ba8,"port number for the local receive port","");
  pOVar2 = CLI::App::add_option_function<int>
                     (pAVar3,&local_b88,(function<void_(const_int_&)> *)&local_c40,&local_ba8);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_508,(char (*) [5])0x43f940,(char (*) [3])0x45a145);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[5],_true>
            (&local_4c8,(char (*) [3])0x45a6dc,(char (*) [5])"-999");
  values_01._M_len = 2;
  values_01._M_array = (iterator)&local_508;
  CLI::Transformer::Transformer<std::__cxx11::string(&)(std::__cxx11::string)>
            ((Transformer *)&local_c20,values_01,CLI::ignore_case);
  local_388._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_388._8_8_ = 0;
  local_378 = (code *)0x0;
  local_370 = local_c10._8_8_;
  if ((code *)local_c10._M_allocated_capacity != (code *)0x0) {
    local_388._M_unused._M_object = local_c20._M_unused._M_object;
    local_388._8_8_ = local_c20._8_8_;
    local_378 = (code *)local_c10._M_allocated_capacity;
    local_c10._M_allocated_capacity = 0;
    local_c10._8_8_ = 0;
  }
  local_368._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_368._8_8_ = 0;
  local_358 = (code *)0x0;
  local_350 = local_bf0._8_8_;
  if ((code *)local_bf0._M_allocated_capacity != (code *)0x0) {
    local_368._M_unused._M_object = local_c00._M_unused._M_object;
    local_368._8_8_ = local_c00._8_8_;
    local_358 = (code *)local_bf0._M_allocated_capacity;
    local_bf0._M_allocated_capacity = 0;
    local_bf0._8_8_ = 0;
  }
  if (local_be0 == &local_bd0) {
    local_338._8_4_ = local_bd0._8_4_;
    local_338._12_4_ = local_bd0._12_4_;
    local_348 = &local_338;
  }
  else {
    local_348 = local_be0;
  }
  local_338._M_allocated_capacity._4_4_ = local_bd0._M_allocated_capacity._4_4_;
  local_338._M_allocated_capacity._0_4_ = local_bd0._M_allocated_capacity._0_4_;
  local_340 = local_bd8;
  local_bd8 = 0;
  local_bd0._M_allocated_capacity._0_4_ = local_bd0._M_allocated_capacity._0_4_ & 0xffffff00;
  local_328 = local_bc0;
  local_324 = local_bbc;
  local_be0 = &local_bd0;
  local_ac8 = local_ab8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac8,"");
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (&pOVar2->validators_,
             (pOVar2->validators_).
             super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
             super__Vector_impl_data._M_start,(value_type *)&local_388);
  if (local_ac0 != 0) {
    local_ae8[0] = local_ad8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_ae8,local_ac8,local_ac0 + (long)local_ac8);
    commandLineParser();
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"HELICS_LOCAL_PORT","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar2->envname_,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_ac8 != local_ab8) {
    operator_delete(local_ac8,local_ab8[0] + 1);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348,local_338._M_allocated_capacity + 1);
  }
  if (local_358 != (code *)0x0) {
    (*local_358)(&local_368,&local_368,__destroy_functor);
  }
  if (local_378 != (code *)0x0) {
    (*local_378)(&local_388,&local_388,__destroy_functor);
  }
  if (local_be0 != &local_bd0) {
    operator_delete(local_be0,
                    CONCAT44(local_bd0._M_allocated_capacity._4_4_,
                             local_bd0._M_allocated_capacity._0_4_) + 1);
  }
  if ((code *)local_bf0._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_bf0._M_allocated_capacity)(&local_c00,&local_c00,3);
  }
  if ((code *)local_c10._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_c10._M_allocated_capacity)(&local_c20,&local_c20,3);
  }
  lVar5 = -0x80;
  paVar6 = &local_4c8.second.field_2;
  do {
    if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar6->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],paVar6->_M_allocated_capacity + 1
                     );
    }
    if (&paVar6->_M_allocated_capacity + -4 != (size_type *)(&paVar6->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar6->_M_allocated_capacity)[-6],
                      (&paVar6->_M_allocated_capacity)[-4] + 1);
    }
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar6->_M_allocated_capacity + -8);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
    operator_delete(local_ba8._M_dataplus._M_p,local_ba8.field_2._M_allocated_capacity + 1);
  }
  if (local_c30 != (_Manager_type)0x0) {
    (*local_c30)(&local_c40,&local_c40,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b88._M_dataplus._M_p != &local_b88.field_2) {
    operator_delete(local_b88._M_dataplus._M_p,local_b88.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_9c8._M_dataplus._M_p = (pointer)&local_9c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c8,"--portstart","");
  local_9e8._M_dataplus._M_p = (pointer)&local_9e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9e8,"starting port for automatic port definitions","");
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar3,&local_9c8,(int *)((long)&variable[5]._M_string_length + 4),&local_9e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e8._M_dataplus._M_p != &local_9e8.field_2) {
    operator_delete(local_9e8._M_dataplus._M_p,local_9e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
    operator_delete(local_9c8._M_dataplus._M_p,local_9c8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_a08._M_dataplus._M_p = (pointer)&local_a08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a08,"encryption","");
  local_a28._M_dataplus._M_p = (pointer)&local_a28.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a28,"options related to encryption","");
  pAVar3 = &CLI::App::add_option_group<CLI::Option_group>(pAVar3,&local_a08,&local_a28)->super_App;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a28._M_dataplus._M_p != &local_a28.field_2) {
    operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
    operator_delete(local_a08._M_dataplus._M_p,local_a08.field_2._M_allocated_capacity + 1);
  }
  local_a48._M_dataplus._M_p = (pointer)&local_a48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a48,"--encrypted","");
  local_a68._M_dataplus._M_p = (pointer)&local_a68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a68,"enable encryption on the network","");
  pOVar2 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                     (pAVar3,&local_a48,(bool *)((long)&variable[6]._M_dataplus._M_p + 5),&local_a68
                     );
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"HELICS_ENCRYPTION","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar2->envname_,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
    operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a48._M_dataplus._M_p != &local_a48.field_2) {
    operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
  }
  local_a88._M_dataplus._M_p = (pointer)&local_a88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,"--encryption_config","");
  local_aa8._M_dataplus._M_p = (pointer)&local_aa8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_aa8,"set the configuration file for encryption options","");
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar3,&local_a88,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &variable[6]._M_string_length,&local_aa8);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"HELICS_ENCRYPTION_CONFIG","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar2->envname_,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  local_240._8_8_ = 0;
  local_228 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:181:28)>
              ::_M_invoke;
  local_230 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:181:28)>
              ::_M_manager;
  local_240._M_unused._0_8_ = variable;
  helicsCLI11App::add_callback
            ((helicsCLI11App *)(this->brokerName)._M_dataplus._M_p,(function<void_()> *)&local_240);
  _Var4._M_pi = extraout_RDX;
  if (local_230 != (code *)0x0) {
    (*local_230)(&local_240,&local_240,__destroy_functor);
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar7.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar7.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar7.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> NetworkBrokerData::commandLineParser(std::string_view localAddress,
                                                                     bool enableConfig)
{
    auto nbparser = std::make_shared<helicsCLI11App>(
        "Network connection information \n(arguments allow '_' characters in the names and ignore them)");
    if (enableConfig) {
        auto* fmtr = addJsonConfig(nbparser.get());
        fmtr->maxLayers(0);
        fmtr->promoteSection("helics");
    }
    nbparser->option_defaults()->ignore_underscore()->ignore_case();

    auto* interfaceFlag = nbparser
                              ->add_flag("--local{0},--ipv4{4},--ipv6{6},--all{10},--external{10}",
                                         interfaceNetwork,
                                         "specify external interface to use, default is --local")
                              ->disable_flag_override();
    nbparser
        ->add_option("--network_connectivity",
                     interfaceNetwork,
                     "specify the connectivity of the network interface")
        ->transform(CLI::CheckedTransformer(
            {{"local", "0"}, {"ipv4", "4"}, {"ipv6", "6"}, {"external", "10"}, {"all", "10"}}))
        ->excludes(interfaceFlag);
    nbparser
        ->add_option_function<std::string>(
            "--broker_address",
            [this, localAddress](const std::string& addr) {
                auto brkprt = gmlc::networking::extractInterfaceAndPort(addr);
                brokerAddress = brkprt.first;
                brokerPort = brkprt.second;
                checkAndUpdateBrokerAddress(localAddress);
            },
            "location of the broker i.e. network address")
        ->envname("HELICS_BROKER_ADDRESS");
    nbparser->add_flag("--reuse_address",
                       reuse_address,
                       "allow the server to reuse a bound address, mostly useful for tcp cores");
    nbparser
        ->add_flag(
            "--noackconnect",
            noAckConnection,
            "specify that a connection_ack message is not required to be connected with a broker")
        ->ignore_underscore();

    nbparser->add_flag(
        "--force",
        forceConnection,
        "if set to true the broker will on an unsuccessful connection as root broker attempt to terminate any existing brokers and reconnect");
    nbparser->add_option_function<std::string>(
        "--broker",
        [this, localAddress](std::string addr) {
            auto brkr = BrokerFactory::findBroker(addr);
            if (brkr) {
                addr = brkr->getAddress();
            }
            if (brokerAddress.empty()) {
                auto brkprt = gmlc::networking::extractInterfaceAndPort(addr);
                brokerAddress = brkprt.first;
                brokerPort = brkprt.second;
                checkAndUpdateBrokerAddress(localAddress);
            } else {
                brokerName = addr;
            }
        },
        "identifier for the broker, this is either the name or network address use --broker_address or --brokername "
        "to explicitly set the network address or name the search for the broker is first by name");

    nbparser->add_option("--brokername", brokerName, "the name of the broker");
    nbparser->add_option("--maxsize", maxMessageSize, "The message buffer size")
        ->capture_default_str()
        ->check(CLI::PositiveNumber);
    nbparser
        ->add_option("--maxcount",
                     maxMessageCount,
                     "The maximum number of message to have in a queue")
        ->capture_default_str()
        ->check(CLI::PositiveNumber);
    nbparser->add_option("--networkretries", maxRetries, "the maximum number of network retries")
        ->capture_default_str();
    nbparser->add_flag("--useosport",
                       use_os_port,
                       "specify that the ports should be allocated by the host operating system");
    nbparser->add_flag("--autobroker",
                       autobroker,
                       "allow a broker to be automatically created if one is not available");
    nbparser->add_option("--brokerinitstring",
                         brokerInitString,
                         "the initialization string for the broker");
    nbparser
        ->add_option("--brokerinit", brokerInitString, "the initialization string for the broker")
        ->envname("HELICS_BROKER_INIT");
    nbparser
        ->add_flag_function(
            "--client{0},--server{1}",
            [this](int64_t val) {
                switch (server_mode) {
                    case ServerModeOptions::UNSPECIFIED:
                    case ServerModeOptions::SERVER_DEFAULT_ACTIVE:
                    case ServerModeOptions::SERVER_DEFAULT_DEACTIVATED:
                        server_mode = (val > 0) ? ServerModeOptions::SERVER_ACTIVE :
                                                  ServerModeOptions::SERVER_DEACTIVATED;
                        break;
                    default:
                        break;
                }
            },
            "specify that the network connection should be a server or client")
        ->disable_flag_override();
    nbparser->add_option_function<std::string>(
        "--local_interface",
        [this](const std::string& addr) {
            auto localprt = gmlc::networking::extractInterfaceAndPort(addr);
            localInterface = localprt.first;
            // this may get overridden later
            portNumber = localprt.second;
        },
        "the local interface to use for the receive ports");
    nbparser->add_option("--port,-p", portNumber, "port number to use")
        ->transform(CLI::Transformer({{"auto", "-1"}}, CLI::ignore_case));
    nbparser
        ->add_option("--brokerport",
                     brokerPort,
                     "the port number to use to connect with the broker")
        ->envname("HELICS_BROKER_PORT");

    nbparser
        ->add_option("--connectionport",
                     connectionPort,
                     "the port number to use to connect a co-simulation")
        ->envname("HELICS_CONNECTION_PORT");
    nbparser
        ->add_option("--connectionaddress",
                     connectionAddress,
                     "the network address to use to connect a co-simulation")
        ->envname("HELICS_CONNECTION_ADDRESS");
    nbparser
        ->add_option_function<int>(
            "--localport",
            [this](int port) {
                if (port == -999) {
                    use_os_port = true;
                } else {
                    portNumber = port;
                }
            },
            "port number for the local receive port")
        ->transform(CLI::Transformer({{"auto", "-1"}, {"os", "-999"}}, CLI::ignore_case))
        ->envname("HELICS_LOCAL_PORT");
    nbparser->add_option("--portstart", portStart, "starting port for automatic port definitions");

    auto* encrypt_group = nbparser->add_option_group("encryption", "options related to encryption");
    encrypt_group->add_flag("--encrypted", encrypted, "enable encryption on the network")
        ->envname("HELICS_ENCRYPTION");
    encrypt_group
        ->add_option("--encryption_config",
                     encryptionConfig,
                     "set the configuration file for encryption options")
        ->envname("HELICS_ENCRYPTION_CONFIG");

    nbparser->add_callback([this]() {
        if ((!brokerAddress.empty()) && (brokerPort == -1)) {
            if ((localInterface.empty()) && (portNumber != -1)) {
                std::swap(brokerPort, portNumber);
            }
        }
    });

    return nbparser;
}